

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,bool in_value)

{
  uint *puVar1;
  Am_Wrapper *pAVar2;
  
  if (((short)this->type < 0) && (pAVar2 = (this->value).wrapper_value, pAVar2 != (Am_Wrapper *)0x0)
     ) {
    puVar1 = &pAVar2->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  this->type = 4;
  (this->value).bool_value = in_value;
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(bool in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = Am_BOOL;
  value.bool_value = in_value;
  return *this;
}